

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,_Bool overwrite_dst)

{
  wchar_t wVar1;
  wchar_t wVar2;
  ImWchar *pIVar3;
  char *__function;
  float fVar4;
  
  wVar1 = (this->IndexLookup).Size;
  if (wVar1 < L'\x01') {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xce2,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  if (((uint)dst < (uint)wVar1) && ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst)) {
    return;
  }
  if ((uint)wVar1 <= (uint)src && (uint)wVar1 <= (uint)dst) {
    return;
  }
  GrowIndex(this,dst + 1);
  wVar2 = (this->IndexLookup).Size;
  if ((uint)src < (uint)wVar1) {
    if (wVar2 <= (int)(uint)dst) {
LAB_002123ba:
      __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
      goto LAB_002123e6;
    }
    pIVar3 = (this->IndexLookup).Data;
    pIVar3[dst] = pIVar3[src];
    fVar4 = (this->IndexAdvanceX).Data[src];
  }
  else {
    if (wVar2 <= (int)(uint)dst) goto LAB_002123ba;
    (this->IndexLookup).Data[dst] = 0xffff;
    fVar4 = 1.0;
  }
  if ((int)(uint)dst < (this->IndexAdvanceX).Size) {
    (this->IndexAdvanceX).Data[dst] = fVar4;
    return;
  }
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_002123e6:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x706,__function);
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}